

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zlib_buffer_compressor_test.cpp
# Opt level: O3

void __thiscall
bidfx_public_api::tools::ZLIBBufferCompressorTest_compressor_and_decompressor_can_be_reused_Test::
~ZLIBBufferCompressorTest_compressor_and_decompressor_can_be_reused_Test
          (ZLIBBufferCompressorTest_compressor_and_decompressor_can_be_reused_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer puVar2;
  pointer pcVar3;
  
  (this->super_ZLIBBufferCompressorTest).super_Test._vptr_Test =
       (_func_int **)&PTR__ZLIBBufferCompressorTest_0029d068;
  puVar2 = (this->super_ZLIBBufferCompressorTest).TROUBLING_BUFFER.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar2 != (pointer)0x0) {
    operator_delete(puVar2,(long)(this->super_ZLIBBufferCompressorTest).TROUBLING_BUFFER.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar2);
  }
  pcVar3 = (this->super_ZLIBBufferCompressorTest).BIGGER_TEXT._M_dataplus._M_p;
  paVar1 = &(this->super_ZLIBBufferCompressorTest).BIGGER_TEXT.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar1) {
    operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
  }
  pcVar3 = (this->super_ZLIBBufferCompressorTest).FRACTION_OF_BIGGER_TEXT._M_dataplus._M_p;
  paVar1 = &(this->super_ZLIBBufferCompressorTest).FRACTION_OF_BIGGER_TEXT.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar1) {
    operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
  }
  pcVar3 = (this->super_ZLIBBufferCompressorTest).SMALL_TEXT._M_dataplus._M_p;
  paVar1 = &(this->super_ZLIBBufferCompressorTest).SMALL_TEXT.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar1) {
    operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
  }
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x88);
  return;
}

Assistant:

TEST_F(ZLIBBufferCompressorTest, compressor_and_decompressor_can_be_reused)
{
    ZLIBBufferCompressor compressor1 = ZLIBBufferCompressor(5);
    compressor1.Compress((unsigned char*) &FRACTION_OF_BIGGER_TEXT[0], 0, FRACTION_OF_BIGGER_TEXT.size());
    ByteBuffer compressed1 = compressor1.GetCompressed();

    ZLIBBufferInflator decompressor1;
    ByteBuffer decompressed1 = decompressor1.Inflate(compressed1);
    std::unique_ptr<const char> decompressed_bytes1 = std::unique_ptr<const char>((const char*) decompressed1.ToArray());
    ASSERT_EQ(FRACTION_OF_BIGGER_TEXT, std::string(decompressed_bytes1.get(), decompressed1.ReadableBytes()));

    compressor1.Compress((unsigned char*) &BIGGER_TEXT[0], 0, BIGGER_TEXT.size());
    ByteBuffer compressed2 = compressor1.GetCompressed();

    ByteBuffer decompressed2 = decompressor1.Inflate(compressed2);
    std::unique_ptr<const char> decompressed_bytes2 = std::unique_ptr<const char>((const char*) decompressed2.ToArray());
    EXPECT_EQ(BIGGER_TEXT, std::string(decompressed_bytes2.get(), decompressed2.ReadableBytes()));
}